

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O2

bool __thiscall
AmstradCPC::ConcreteMachine<true>::insert_media(ConcreteMachine<true> *this,Media *media)

{
  __shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  __shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var1 = &((media->tapes).
             super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>;
  if (p_Var1 != &((media->tapes).
                  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>) {
    std::__shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,p_Var1);
    Storage::Tape::TapePlayer::set_tape
              (&(this->tape_player_).super_TapePlayer,(shared_ptr<Storage::Tape::Tape> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    set_use_fast_tape_hack(this);
  }
  p_Var4 = &((media->disks).
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((media->disks).
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>;
  iVar3 = 0;
  do {
    if (p_Var4 == p_Var2) break;
    std::__shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var4);
    Amstrad::FDC::set_disk(&this->fdc_,(shared_ptr<Storage::Disk::Disk> *)&local_40,iVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    iVar3 = iVar3 + 1;
    p_Var4 = p_Var4 + 1;
  } while (iVar3 != 4);
  return (media->disks).
         super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         (media->disks).
         super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
         ._M_impl.super__Vector_impl_data._M_start ||
         (media->tapes).
         super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (media->tapes).
         super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			// If there are any tapes supplied, use the first of them.
			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
				set_use_fast_tape_hack();
			}

			// Insert up to four disks.
			int c = 0;
			for(auto &disk : media.disks) {
				fdc_.set_disk(disk, c);
				c++;
				if(c == 4) break;
			}

			return !media.tapes.empty() || (!media.disks.empty() && has_fdc);
		}